

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended-kalman-filter.cpp
# Opt level: O0

MeasureVector __thiscall
stateObservation::ExtendedKalmanFilter::predictSensor_(ExtendedKalmanFilter *this,TimeIndex k)

{
  bool bVar1;
  TimeIndex TVar2;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar3;
  long in_RDX;
  Index extraout_RDX;
  MeasureVector MVar4;
  Matrix<double,__1,_1,_0,__1,_1> local_30;
  long local_20;
  TimeIndex k_local;
  ExtendedKalmanFilter *this_local;
  
  local_20 = in_RDX;
  k_local = k;
  this_local = this;
  bVar1 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::isSet
                    ((IndexedMatrixT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false> *)(k + 0x1a0));
  if ((!bVar1) ||
     (TVar2 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime
                        ((IndexedMatrixT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false> *)
                         (k + 0x1a0)), TVar2 != local_20)) {
    pMVar3 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::operator()
                       ((IndexedMatrixT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false> *)(k + 0x180)
                       );
    (**(code **)(*(long *)k + 0x220))(&local_30,k,pMVar3,local_20);
    IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::set
              ((IndexedMatrixT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false> *)(k + 0x1a0),
               &local_30,local_20);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_30);
  }
  pMVar3 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::operator()
                     ((IndexedMatrixT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false> *)(k + 0x1a0));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this,pMVar3);
  MVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  MVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (MeasureVector)
         MVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ObserverBase::MeasureVector ExtendedKalmanFilter::predictSensor_(TimeIndex k)
{

  if(!this->ybar_.isSet() || this->ybar_.getTime() != k)
  {
    ybar_.set(simulateSensor_(xbar_(), k), k);
  }

  return ybar_();
}